

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase114::run(TestCase114 *this)

{
  ArrayPtr<kj::String> argValues;
  void *pvVar1;
  DestructionOrderRecorder *pDVar2;
  DestructionOrderRecorder *pDVar3;
  DestructionOrderRecorder *pointer;
  DestructionOrderRecorder *extraout_RDX;
  DestructionOrderRecorder **value;
  DestructionOrderRecorder **value_00;
  DestructionOrderRecorder *ptrCopy_2;
  long lVar4;
  DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t> *in_R8;
  DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t> *in_R9;
  DestructionOrderRecorder *ptrCopy_1;
  DestructionOrderRecorder *ptrCopy;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> OVar5;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 uStack_140;
  uint destroyed3;
  DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
  _kjCondition_1;
  uint destroyed1;
  uint destroyed2;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> obj3;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> obj2;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> combined;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> local_d0;
  DestructionOrderRecorder *ptr;
  uint counter;
  DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_kj::(anonymous_namespace)::DestructionOrderRecorder_*&>
  _kjCondition;
  Array<char> local_88;
  CappedArray<char,_17UL> local_70;
  CappedArray<char,_17UL> local_50;
  
  counter = 0;
  destroyed1 = 0;
  destroyed2 = 0;
  destroyed3 = 0;
  pDVar3 = (DestructionOrderRecorder *)operator_new(0x10);
  pDVar3->counter = &counter;
  pDVar3->recordTo = &destroyed1;
  local_d0.disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  local_d0.ptr = pDVar3;
  pointer = (DestructionOrderRecorder *)operator_new(0x10);
  pointer->counter = &counter;
  pointer->recordTo = &destroyed2;
  obj3.ptr = (DestructionOrderRecorder *)operator_new(0x10);
  (obj3.ptr)->counter = &counter;
  (obj3.ptr)->recordTo = &destroyed3;
  obj3.disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  ptr = pDVar3;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>::
  attach<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)> *)
             &_kjCondition_1,&local_d0);
  OVar5 = Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>::
          attach<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
                    ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)> *)
                     &combined,
                     (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)
                     &_kjCondition_1);
  pvVar1 = _kjCondition_1.right;
  pDVar3 = OVar5.ptr;
  if (_kjCondition_1.right != (void *)0x0) {
    _kjCondition_1.right = (void *)0x0;
    (**(code **)(_kjCondition_1.left)->counter)(_kjCondition_1.left,pvVar1,pDVar3);
    pDVar3 = extraout_RDX;
  }
  _kjCondition.right = &ptr;
  _kjCondition.result = combined.ptr == ptr;
  _kjCondition.left = combined.ptr;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_::Debug::minSeverity < 3 && !_kjCondition.result) {
    str<char_const(&)[39]>
              ((String *)&_kjCondition_1,(kj *)"failed: expected combined.get() == ptr",
               (char (*) [39])CONCAT71((int7)((ulong)pDVar3 >> 8),_kjCondition.result));
    _::
    tryToCharSequence<kj::(anonymous_namespace)::DestructionOrderRecorder*,kj::CappedArray<char,17ul>>
              (&local_50,(_ *)&_kjCondition,value);
    _::
    tryToCharSequence<kj::(anonymous_namespace)::DestructionOrderRecorder*,kj::CappedArray<char,17ul>>
              (&local_70,(_ *)_kjCondition.right,value_00);
    _::concat<kj::CappedArray<char,17ul>,kj::StringPtr&,kj::CappedArray<char,17ul>>
              ((String *)&local_88,(_ *)&local_50,(CappedArray<char,_17UL> *)&_kjCondition.op,
               (StringPtr *)&local_70,(CappedArray<char,_17UL> *)in_R8);
    in_R8 = &_kjCondition_1;
    _kjCondition_1.op.content.size_ = (size_t)local_88.ptr;
    _kjCondition_1._32_8_ = local_88.size_;
    local_88.ptr = (char *)0x0;
    local_88.size_ = 0;
    Array<char>::~Array(&local_88);
    in_R9 = (DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
             *)0x2;
    argValues.size_._0_4_ = uStack_140;
    argValues.ptr = (String *)in_stack_fffffffffffffeb8;
    argValues.size_._4_4_ = destroyed3;
    _::Debug::logInternal
              ((Debug *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,(char *)0x80,2,0x1aaa11,(char *)in_R8,argValues);
    lVar4 = 0x18;
    do {
      Array<char>::~Array((Array<char> *)((long)&_kjCondition_1.left + lVar4));
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != -0x18);
  }
  pDVar3 = local_d0.ptr;
  _kjCondition_1.right = (void *)0x0;
  _kjCondition_1.left = local_d0.ptr;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  if (_::Debug::minSeverity < 3 && local_d0.ptr != (DestructionOrderRecorder *)0x0) {
    _kjCondition_1.result = local_d0.ptr == (DestructionOrderRecorder *)0x0;
    _::Debug::
    log<char_const(&)[39],kj::_::DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder*,decltype(nullptr)>&>
              ((char *)0x82,0x1aaa72,0x1aaaac,(char *)&_kjCondition_1,(char (*) [39])in_R8,in_R9);
  }
  _kjCondition_1.right = (void *)0x0;
  _kjCondition_1.result = pointer == (DestructionOrderRecorder *)0x0;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  if (_::Debug::minSeverity < 3 && !_kjCondition_1.result) {
    _kjCondition_1.left = pointer;
    _::Debug::
    log<char_const(&)[39],kj::_::DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder*,decltype(nullptr)>&>
              ((char *)0x83,0x1aaad3,0x1aab0d,(char *)&_kjCondition_1,(char (*) [39])in_R8,in_R9);
  }
  pDVar2 = obj3.ptr;
  _kjCondition_1.right = (void *)0x0;
  _kjCondition_1.left = obj3.ptr;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result = obj3.ptr == (DestructionOrderRecorder *)0x0;
  if ((!_kjCondition_1.result) && (_::Debug::minSeverity < 3)) {
    _::Debug::
    log<char_const(&)[39],kj::_::DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder*,decltype(nullptr)>&>
              ((char *)0x84,0x1aab34,0x1aab6e,(char *)&_kjCondition_1,(char (*) [39])in_R8,in_R9);
  }
  _kjCondition_1.right = (void *)((ulong)_kjCondition_1.right & 0xffffffff00000000);
  _kjCondition_1.result = destroyed1 == 0;
  _kjCondition_1.left = (DestructionOrderRecorder *)&destroyed1;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  if ((!_kjCondition_1.result) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x85,ERROR,"\"failed: expected \" \"destroyed1 == 0\", _kjCondition",
               (char (*) [33])"failed: expected destroyed1 == 0",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition_1);
  }
  _kjCondition_1.right = (void *)((ulong)_kjCondition_1.right & 0xffffffff00000000);
  _kjCondition_1.result = destroyed2 == 0;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  if ((!_kjCondition_1.result) && (_::Debug::minSeverity < 3)) {
    _kjCondition_1.left = (DestructionOrderRecorder *)&destroyed2;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x86,ERROR,"\"failed: expected \" \"destroyed2 == 0\", _kjCondition",
               (char (*) [33])"failed: expected destroyed2 == 0",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition_1);
  }
  _kjCondition_1.right = (void *)((ulong)_kjCondition_1.right & 0xffffffff00000000);
  _kjCondition_1.left = (DestructionOrderRecorder *)&destroyed3;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result = destroyed3 == 0;
  if ((destroyed3 != 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x87,ERROR,"\"failed: expected \" \"destroyed3 == 0\", _kjCondition",
               (char (*) [33])"failed: expected destroyed3 == 0",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition_1);
  }
  if (combined.ptr != (DestructionOrderRecorder *)0x0) {
    combined.ptr = (DestructionOrderRecorder *)0x0;
    (**(combined.disposer)->_vptr_Disposer)();
  }
  _kjCondition_1.left = (DestructionOrderRecorder *)&destroyed1;
  _kjCondition_1.right = (void *)CONCAT44(_kjCondition_1.right._4_4_,1);
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  if (_::Debug::minSeverity < 3 && destroyed1 != 1) {
    _kjCondition_1.result = destroyed1 == 1;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x8b,ERROR,"\"failed: expected \" \"destroyed1 == 1\", _kjCondition, destroyed1",
               (char (*) [33])"failed: expected destroyed1 == 1",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition_1,(uint *)_kjCondition_1.left);
  }
  _kjCondition_1.result = destroyed2 == 2;
  _kjCondition_1.right = (void *)CONCAT44(_kjCondition_1.right._4_4_,2);
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  if (_::Debug::minSeverity < 3 && !_kjCondition_1.result) {
    _kjCondition_1.left = (DestructionOrderRecorder *)&destroyed2;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x8c,ERROR,"\"failed: expected \" \"destroyed2 == 2\", _kjCondition, destroyed2",
               (char (*) [33])"failed: expected destroyed2 == 2",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition_1,(uint *)&destroyed2);
  }
  _kjCondition_1.left = (DestructionOrderRecorder *)&destroyed3;
  _kjCondition_1.right = (void *)CONCAT44(_kjCondition_1.right._4_4_,3);
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result = destroyed3 == 3;
  if ((destroyed3 != 3) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x8d,ERROR,"\"failed: expected \" \"destroyed3 == 3\", _kjCondition, destroyed3",
               (char (*) [33])"failed: expected destroyed3 == 3",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition_1,&destroyed3);
  }
  if (pDVar2 != (DestructionOrderRecorder *)0x0) {
    obj3.ptr = (DestructionOrderRecorder *)0x0;
    (**(obj3.disposer)->_vptr_Disposer)(obj3.disposer,pDVar2);
  }
  if (pointer != (DestructionOrderRecorder *)0x0) {
    _::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::disposeImpl
              ((HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder> *)
               &_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance,
               pointer);
  }
  if (pDVar3 != (DestructionOrderRecorder *)0x0) {
    (**(local_d0.disposer)->_vptr_Disposer)(local_d0.disposer,pDVar3);
  }
  return;
}

Assistant:

TEST(Memory, AttachNested) {
  uint counter = 0;
  uint destroyed1 = 0;
  uint destroyed2 = 0;
  uint destroyed3 = 0;

  auto obj1 = kj::heap<DestructionOrderRecorder>(counter, destroyed1);
  auto obj2 = kj::heap<DestructionOrderRecorder>(counter, destroyed2);
  auto obj3 = kj::heap<DestructionOrderRecorder>(counter, destroyed3);

  auto ptr = obj1.get();

  Own<DestructionOrderRecorder> combined = obj1.attach(kj::mv(obj2)).attach(kj::mv(obj3));

  KJ_EXPECT(combined.get() == ptr);

  KJ_EXPECT(obj1.get() == nullptr);
  KJ_EXPECT(obj2.get() == nullptr);
  KJ_EXPECT(obj3.get() == nullptr);
  KJ_EXPECT(destroyed1 == 0);
  KJ_EXPECT(destroyed2 == 0);
  KJ_EXPECT(destroyed3 == 0);

  combined = nullptr;

  KJ_EXPECT(destroyed1 == 1, destroyed1);
  KJ_EXPECT(destroyed2 == 2, destroyed2);
  KJ_EXPECT(destroyed3 == 3, destroyed3);
}